

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O2

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPData
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,void *zipData,size_t zipSize)

{
  INodeMap *pIVar1;
  int *piVar2;
  ExceptionReporter<GenICam_3_4::RuntimeException> *this_00;
  CNodeMapFactory nodeMapData;
  ExceptionReporter<GenICam_3_4::RuntimeException> local_c0;
  
  if (this->_Ptr == (INodeMap *)0x0) {
    GenApi_3_4::CNodeMapFactory::CNodeMapFactory(&nodeMapData,1,zipData,zipSize,0,0);
    GenICam_3_4::gcstring::gcstring(&local_c0.m_SourceFileName,"Device");
    pIVar1 = (INodeMap *)
             GenApi_3_4::CNodeMapFactory::CreateNodeMap((gcstring *)&nodeMapData,SUB81(&local_c0,0))
    ;
    GenICam_3_4::gcstring::~gcstring(&local_c0.m_SourceFileName);
    piVar2 = (int *)operator_new(4);
    *piVar2 = 0;
    if (pIVar1 != (INodeMap *)0x0) {
      *piVar2 = 1;
      this->_Ptr = pIVar1;
      this->_pRefCount = piVar2;
    }
    GenApi_3_4::CNodeMapFactory::~CNodeMapFactory(&nodeMapData);
    return;
  }
  this_00 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/NodeMapRef.h"
             ,0x181,"RuntimeException");
  GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
            (this_00,(char *)&local_c0,"Node map already created");
  __cxa_throw(this_00,&GenICam_3_4::RuntimeException::typeinfo,
              GenICam_3_4::GenericException::~GenericException);
}

Assistant:

inline void CNodeMapRefT<TCameraParams>::_LoadXMLFromZIPData(const void* zipData, size_t zipSize)
    {
        // Load the DLL
        if(_Ptr)
            throw RUNTIME_EXCEPTION("Node map already created");

        // Load the XML file
        CNodeMapFactory nodeMapData(ContentType_ZippedXml, zipData, zipSize);

        // First create node map then the reference counter. This prevents a leak in case of bad node map
        INodeMap* pNodeMap = nodeMapData.CreateNodeMap();
        Attach( pNodeMap, _DeviceName, new int( 0 ) );
    }